

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O0

uint av1_int_pro_motion_estimation
               (AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,int mi_row,int mi_col,MV *ref_mv,
               uint *y_sad_zero,int me_search_size_col,int me_search_size_row)

{
  byte bVar1;
  FULLPEL_MV FVar2;
  short sVar3;
  short sVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  YV12_BUFFER_CONFIG *pYVar12;
  int16_t *piVar13;
  int16_t *piVar14;
  int16_t *piVar15;
  int16_t *piVar16;
  int in_ECX;
  long lVar17;
  long lVar18;
  byte in_DL;
  long in_RSI;
  long *in_RDI;
  int in_R8D;
  MV *in_R9;
  bool bVar19;
  uint *in_stack_00000008;
  int i_2;
  FullMvLimits mv_limits;
  uint8_t *pos [4];
  FULLPEL_MV this_mv;
  int16_t *src_vbuf;
  int16_t *src_hbuf;
  int16_t *vbuf;
  int16_t *hbuf;
  int height_ref_buf;
  int width_ref_buf;
  int i_1;
  int i;
  YV12_BUFFER_CONFIG *scaled_ref_frame;
  int col_norm_factor;
  int row_norm_factor;
  int best_sad_row;
  int best_sad_col;
  uint this_sad [4];
  uint tmp_sad;
  uint best_sad;
  int_mv *best_int_mv;
  uint8_t *src_buf;
  uint8_t *ref_buf;
  int ref_stride;
  int src_stride;
  int search_size_height;
  int search_size_width;
  int border;
  _Bool screen_scroll_superblock;
  int full_search;
  int is_screen;
  int bh;
  int bw;
  int idx;
  buf_2d backup_yv12 [3];
  MB_MODE_INFO *mi;
  MACROBLOCKD *xd;
  AV1_COMMON *cm;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  uint in_stack_fffffffffffffe70;
  uint uVar20;
  int in_stack_fffffffffffffe74;
  undefined8 in_stack_fffffffffffffe78;
  AV1_COMP *in_stack_fffffffffffffe80;
  int *in_stack_fffffffffffffe88;
  undefined8 in_stack_fffffffffffffe90;
  int full_search_00;
  undefined8 in_stack_fffffffffffffe98;
  int16_t *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  undefined2 in_stack_fffffffffffffeac;
  undefined2 in_stack_fffffffffffffeae;
  scale_factors *in_stack_fffffffffffffeb0;
  undefined8 in_stack_fffffffffffffeb8;
  YV12_BUFFER_CONFIG *in_stack_fffffffffffffec0;
  undefined8 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  int local_128;
  int local_124;
  int in_stack_fffffffffffffef0;
  int local_10c;
  uint local_108 [4];
  uint local_f8;
  uint local_f4;
  FULLPEL_MV *local_f0;
  uint8_t *local_e8;
  uint8_t *local_e0;
  int local_d4;
  int local_c8;
  uint uVar21;
  int local_ac;
  long local_a8 [14];
  long *local_38;
  MV *local_30;
  int local_24;
  int local_20;
  byte local_19;
  long local_18;
  long *local_10;
  uint local_4;
  
  full_search_00 = (int)((ulong)in_stack_fffffffffffffe90 >> 0x20);
  iVar11 = (int)((ulong)in_stack_fffffffffffffec8 >> 0x20);
  iVar10 = SUB84(in_stack_fffffffffffffe78,4);
  local_38 = in_RDI + 0x77f0;
  local_a8[0xd] = in_RSI + 0x1a0;
  local_a8[0xc] = **(undefined8 **)(in_RSI + 0x2058);
  local_30 = in_R9;
  local_24 = in_R8D;
  local_20 = in_ECX;
  local_19 = in_DL;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(local_a8,0,0x60);
  uVar5 = (uint)block_size_wide[local_19];
  uVar6 = (uint)block_size_high[local_19];
  bVar19 = *(int *)((long)local_10 + 0x4269c) == 1;
  uVar20 = in_stack_fffffffffffffe70 & 0xffffff;
  if (bVar19) {
    uVar20 = CONCAT13(local_19 == *(byte *)(local_38[0xc11] + 0x1c),(int3)in_stack_fffffffffffffe70)
    ;
  }
  uVar21 = uVar20 & 0xff000000;
  iVar7 = *(int *)((long)local_10 + 0x42724) >> 4;
  iVar8 = iVar7 * 0x10;
  local_c8 = mv_limits.col_min;
  iVar9 = local_24 * 4 - mv_limits.col_min;
  if ((SBORROW4(iVar9,iVar7 * -0x10) != iVar9 + iVar8 < 0) ||
     ((int)local_38[7] + iVar8 < local_24 * 4 + mv_limits.col_min)) {
    local_c8 = iVar8;
  }
  iVar9 = local_20 * 4 - mv_limits.row_min;
  if ((SBORROW4(iVar9,iVar7 * -0x10) != iVar9 + iVar8 < 0) ||
     (*(int *)((long)local_38 + 0x3c) + iVar8 < local_20 * 4 + mv_limits.row_min)) {
    mv_limits.row_min = iVar8;
  }
  iVar7 = *(int *)(local_18 + 0x48);
  local_d4 = *(int *)(local_a8[0xd] + 0x58);
  local_f0 = (FULLPEL_MV *)(**(long **)(local_a8[0xd] + 0x1eb8) + 8);
  bVar1 = ""[local_19];
  iVar8 = ((int)uVar5 >> 5) + 3;
  pYVar12 = av1_get_scaled_ref_frame(in_stack_fffffffffffffe80,iVar10);
  if (pYVar12 != (YV12_BUFFER_CONFIG *)0x0) {
    for (local_124 = 0; local_124 < 3; local_124 = local_124 + 1) {
      lVar17 = (long)local_124;
      lVar18 = local_a8[0xd] + 0x10 + (long)local_124 * 0xa30;
      local_a8[lVar17 * 4] = *(long *)(lVar18 + 0x30);
      local_a8[lVar17 * 4 + 1] = *(long *)(lVar18 + 0x38);
      local_a8[lVar17 * 4 + 2] = *(long *)(lVar18 + 0x40);
      local_a8[lVar17 * 4 + 3] = *(long *)(lVar18 + 0x48);
    }
    in_stack_fffffffffffffe68 = 3;
    av1_setup_pre_planes
              ((MACROBLOCKD *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),iVar11,
               in_stack_fffffffffffffec0,(int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
               (int)in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,in_stack_fffffffffffffef0);
  }
  if (*(int *)(local_a8[0xd] + 0x29a0) == 8) {
    iVar10 = local_c8 * 2 + uVar5;
    iVar11 = mv_limits.row_min * 2 + uVar6;
    piVar13 = (int16_t *)aom_malloc(0x28cb64);
    piVar14 = (int16_t *)aom_malloc(0x28cb76);
    piVar15 = (int16_t *)aom_malloc(0x28cb8b);
    piVar16 = (int16_t *)aom_malloc(0x28cba0);
    if ((((piVar13 == (int16_t *)0x0) || (piVar14 == (int16_t *)0x0)) || (piVar15 == (int16_t *)0x0)
        ) || (piVar16 == (int16_t *)0x0)) {
      aom_free((void *)CONCAT44(in_stack_fffffffffffffe74,uVar20));
      aom_free((void *)CONCAT44(in_stack_fffffffffffffe74,uVar20));
      aom_free((void *)CONCAT44(in_stack_fffffffffffffe74,uVar20));
      aom_free((void *)CONCAT44(in_stack_fffffffffffffe74,uVar20));
      aom_internal_error(*(aom_internal_error_info **)(local_a8[0xd] + 0x29f0),AOM_CODEC_MEM_ERROR,
                         "Failed to allocate hbuf, vbuf, src_hbuf, or src_vbuf");
    }
    local_e0 = (uint8_t *)(*(long *)(local_a8[0xd] + 0x40) - (long)local_c8);
    (*aom_int_pro_row)(piVar13,local_e0,local_d4,iVar10,uVar6,bVar1 + 1);
    local_e0 = (uint8_t *)(*(long *)(local_a8[0xd] + 0x40) - (long)(mv_limits.row_min * local_d4));
    (*aom_int_pro_col)(piVar14,local_e0,local_d4,uVar5,iVar11,iVar8);
    local_e8 = *(uint8_t **)(local_18 + 0x30);
    (*aom_int_pro_row)(piVar15,local_e8,iVar7,uVar5,uVar6,bVar1 + 1);
    (*aom_int_pro_col)(piVar16,local_e8,iVar7,uVar5,uVar6,iVar8);
    iVar10 = av1_vector_match((int16_t *)
                              CONCAT26(in_stack_fffffffffffffeae,
                                       CONCAT24(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8)
                                      ),in_stack_fffffffffffffea0,
                              (int)((ulong)in_stack_fffffffffffffe98 >> 0x20),
                              (int)in_stack_fffffffffffffe98,full_search_00,
                              in_stack_fffffffffffffe88);
    local_f0->col = (int16_t)iVar10;
    iVar10 = av1_vector_match((int16_t *)
                              CONCAT26(in_stack_fffffffffffffeae,
                                       CONCAT24(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8)
                                      ),in_stack_fffffffffffffea0,
                              (int)((ulong)in_stack_fffffffffffffe98 >> 0x20),
                              (int)in_stack_fffffffffffffe98,full_search_00,
                              in_stack_fffffffffffffe88);
    local_f0->row = (int16_t)iVar10;
    if (bVar19) {
      if (local_10c < in_stack_fffffffffffffef0) {
        local_f0->row = 0;
      }
      else {
        local_f0->col = 0;
      }
    }
    sVar3 = (*local_f0).row;
    sVar4 = (*local_f0).col;
    local_e8 = *(uint8_t **)(local_18 + 0x30);
    local_e0 = get_buf_from_fullmv((buf_2d *)CONCAT44(in_stack_fffffffffffffe74,uVar20),
                                   (FULLPEL_MV *)
                                   CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    local_f4 = (**(code **)(*local_10 + 0xc900 + (ulong)local_19 * 0x70))
                         (local_e8,iVar7,local_e0,local_d4);
    if (*local_f0 == (FULLPEL_MV)0x0) {
      *in_stack_00000008 = local_f4;
    }
    else {
      local_f8 = (**(code **)(*local_10 + 0xc900 + (ulong)local_19 * 0x70))
                           (*(undefined8 *)(local_18 + 0x30),iVar7,
                            *(undefined8 *)(local_a8[0xd] + 0x40),local_d4);
      *in_stack_00000008 = local_f8;
      if (local_f8 < local_f4) {
        local_f0->row = 0;
        local_f0->col = 0;
        sVar3 = (*local_f0).row;
        sVar4 = (*local_f0).col;
        local_e0 = *(uint8_t **)(local_a8[0xd] + 0x40);
        local_f4 = local_f8;
      }
    }
    if ((uVar21 & 0x1000000) == 0) {
      (**(code **)(*local_10 + (ulong)local_19 * 0x70 + 0xc930))
                (local_e8,iVar7,&stack0xfffffffffffffe88,local_d4,local_108);
      for (local_ac = 0; local_ac < 4; local_ac = local_ac + 1) {
        if (local_108[local_ac] < local_f4) {
          local_f4 = local_108[local_ac];
          local_f0->row = av1_int_pro_motion_estimation::search_pos[local_ac].row + sVar3;
          local_f0->col = av1_int_pro_motion_estimation::search_pos[local_ac].col + sVar4;
        }
      }
      if (local_108[0] < local_108[3]) {
        sVar3 = sVar3 + -1;
      }
      else {
        sVar3 = sVar3 + 1;
      }
      if (local_108[1] < local_108[2]) {
        sVar4 = sVar4 + -1;
      }
      else {
        sVar4 = sVar4 + 1;
      }
      local_e0 = get_buf_from_fullmv((buf_2d *)CONCAT44(in_stack_fffffffffffffe74,uVar20),
                                     (FULLPEL_MV *)
                                     CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      local_f8 = (**(code **)(*local_10 + 0xc900 + (ulong)local_19 * 0x70))
                           (local_e8,iVar7,local_e0,local_d4);
      if (local_f8 < local_f4) {
        FVar2.col = sVar4;
        FVar2.row = sVar3;
        *local_f0 = FVar2;
        local_f4 = local_f8;
      }
    }
    av1_set_mv_search_range((FullMvLimits *)&stack0xfffffffffffffe78,local_30);
    clamp_fullmv((FULLPEL_MV *)CONCAT44(in_stack_fffffffffffffe74,uVar20),
                 (FullMvLimits *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    convert_fullmv_to_mv((int_mv *)CONCAT44(in_stack_fffffffffffffe74,uVar20));
    if (pYVar12 != (YV12_BUFFER_CONFIG *)0x0) {
      for (in_stack_fffffffffffffe74 = 0; in_stack_fffffffffffffe74 < 3;
          in_stack_fffffffffffffe74 = in_stack_fffffffffffffe74 + 1) {
        lVar17 = local_a8[0xd] + 0x10 + (long)in_stack_fffffffffffffe74 * 0xa30;
        lVar18 = (long)in_stack_fffffffffffffe74;
        *(long *)(lVar17 + 0x30) = local_a8[lVar18 * 4];
        *(long *)(lVar17 + 0x38) = local_a8[lVar18 * 4 + 1];
        *(long *)(lVar17 + 0x40) = local_a8[lVar18 * 4 + 2];
        *(long *)(lVar17 + 0x48) = local_a8[lVar18 * 4 + 3];
      }
    }
    aom_free((void *)CONCAT44(in_stack_fffffffffffffe74,uVar20));
    aom_free((void *)CONCAT44(in_stack_fffffffffffffe74,uVar20));
    aom_free((void *)CONCAT44(in_stack_fffffffffffffe74,uVar20));
    aom_free((void *)CONCAT44(in_stack_fffffffffffffe74,uVar20));
    local_4 = local_f4;
  }
  else {
    local_f0->row = 0;
    local_f0->col = 0;
    local_4 = (**(code **)(*local_10 + 0xc900 + (ulong)local_19 * 0x70))
                        (*(undefined8 *)(local_18 + 0x30),iVar7,
                         *(undefined8 *)(local_a8[0xd] + 0x40),local_d4);
    local_f4 = local_4;
    if (pYVar12 != (YV12_BUFFER_CONFIG *)0x0) {
      for (local_128 = 0; local_128 < 3; local_128 = local_128 + 1) {
        lVar17 = local_a8[0xd] + 0x10 + (long)local_128 * 0xa30;
        lVar18 = (long)local_128;
        *(long *)(lVar17 + 0x30) = local_a8[lVar18 * 4];
        *(long *)(lVar17 + 0x38) = local_a8[lVar18 * 4 + 1];
        *(long *)(lVar17 + 0x40) = local_a8[lVar18 * 4 + 2];
        *(long *)(lVar17 + 0x48) = local_a8[lVar18 * 4 + 3];
      }
    }
  }
  return local_4;
}

Assistant:

unsigned int av1_int_pro_motion_estimation(const AV1_COMP *cpi, MACROBLOCK *x,
                                           BLOCK_SIZE bsize, int mi_row,
                                           int mi_col, const MV *ref_mv,
                                           unsigned int *y_sad_zero,
                                           int me_search_size_col,
                                           int me_search_size_row) {
  const AV1_COMMON *const cm = &cpi->common;
  MACROBLOCKD *xd = &x->e_mbd;
  MB_MODE_INFO *mi = xd->mi[0];
  struct buf_2d backup_yv12[MAX_MB_PLANE] = { { 0, 0, 0, 0, 0 } };
  int idx;
  const int bw = block_size_wide[bsize];
  const int bh = block_size_high[bsize];
  const int is_screen = cpi->oxcf.tune_cfg.content == AOM_CONTENT_SCREEN;
  const int full_search = is_screen;
  const bool screen_scroll_superblock =
      is_screen && bsize == cm->seq_params->sb_size;
  // Keep border a multiple of 16.
  const int border = (cpi->oxcf.border_in_pixels >> 4) << 4;
  int search_size_width = me_search_size_col;
  int search_size_height = me_search_size_row;
  // Adjust based on boundary.
  if (((mi_col << 2) - search_size_width < -border) ||
      ((mi_col << 2) + search_size_width > cm->width + border))
    search_size_width = border;
  if (((mi_row << 2) - search_size_height < -border) ||
      ((mi_row << 2) + search_size_height > cm->height + border))
    search_size_height = border;
  const int src_stride = x->plane[0].src.stride;
  const int ref_stride = xd->plane[0].pre[0].stride;
  uint8_t const *ref_buf, *src_buf;
  int_mv *best_int_mv = &xd->mi[0]->mv[0];
  unsigned int best_sad, tmp_sad, this_sad[4];
  int best_sad_col, best_sad_row;
  const int row_norm_factor = mi_size_high_log2[bsize] + 1;
  const int col_norm_factor = 3 + (bw >> 5);
  const YV12_BUFFER_CONFIG *scaled_ref_frame =
      av1_get_scaled_ref_frame(cpi, mi->ref_frame[0]);
  static const MV search_pos[4] = {
    { -1, 0 },
    { 0, -1 },
    { 0, 1 },
    { 1, 0 },
  };

  if (scaled_ref_frame) {
    int i;
    // Swap out the reference frame for a version that's been scaled to
    // match the resolution of the current frame, allowing the existing
    // motion search code to be used without additional modifications.
    for (i = 0; i < MAX_MB_PLANE; i++) backup_yv12[i] = xd->plane[i].pre[0];
    av1_setup_pre_planes(xd, 0, scaled_ref_frame, mi_row, mi_col, NULL,
                         MAX_MB_PLANE);
  }

  if (xd->bd != 8) {
    best_int_mv->as_fullmv = kZeroFullMv;
    best_sad = cpi->ppi->fn_ptr[bsize].sdf(x->plane[0].src.buf, src_stride,
                                           xd->plane[0].pre[0].buf, ref_stride);

    if (scaled_ref_frame) {
      int i;
      for (i = 0; i < MAX_MB_PLANE; i++) xd->plane[i].pre[0] = backup_yv12[i];
    }
    return best_sad;
  }
  const int width_ref_buf = (search_size_width << 1) + bw;
  const int height_ref_buf = (search_size_height << 1) + bh;
  int16_t *hbuf = (int16_t *)aom_malloc(width_ref_buf * sizeof(*hbuf));
  int16_t *vbuf = (int16_t *)aom_malloc(height_ref_buf * sizeof(*vbuf));
  int16_t *src_hbuf = (int16_t *)aom_malloc(bw * sizeof(*src_hbuf));
  int16_t *src_vbuf = (int16_t *)aom_malloc(bh * sizeof(*src_vbuf));
  if (!hbuf || !vbuf || !src_hbuf || !src_vbuf) {
    aom_free(hbuf);
    aom_free(vbuf);
    aom_free(src_hbuf);
    aom_free(src_vbuf);
    aom_internal_error(xd->error_info, AOM_CODEC_MEM_ERROR,
                       "Failed to allocate hbuf, vbuf, src_hbuf, or src_vbuf");
  }

  // Set up prediction 1-D reference set for rows.
  ref_buf = xd->plane[0].pre[0].buf - search_size_width;
  aom_int_pro_row(hbuf, ref_buf, ref_stride, width_ref_buf, bh,
                  row_norm_factor);

  // Set up prediction 1-D reference set for cols
  ref_buf = xd->plane[0].pre[0].buf - search_size_height * ref_stride;
  aom_int_pro_col(vbuf, ref_buf, ref_stride, bw, height_ref_buf,
                  col_norm_factor);

  // Set up src 1-D reference set
  src_buf = x->plane[0].src.buf;
  aom_int_pro_row(src_hbuf, src_buf, src_stride, bw, bh, row_norm_factor);
  aom_int_pro_col(src_vbuf, src_buf, src_stride, bw, bh, col_norm_factor);

  // Find the best match per 1-D search
  best_int_mv->as_fullmv.col =
      av1_vector_match(hbuf, src_hbuf, mi_size_wide_log2[bsize],
                       search_size_width, full_search, &best_sad_col);
  best_int_mv->as_fullmv.row =
      av1_vector_match(vbuf, src_vbuf, mi_size_high_log2[bsize],
                       search_size_height, full_search, &best_sad_row);

  // For screen: select between horiz or vert motion.
  if (is_screen) {
    if (best_sad_col < best_sad_row)
      best_int_mv->as_fullmv.row = 0;
    else
      best_int_mv->as_fullmv.col = 0;
  }

  FULLPEL_MV this_mv = best_int_mv->as_fullmv;
  src_buf = x->plane[0].src.buf;
  ref_buf = get_buf_from_fullmv(&xd->plane[0].pre[0], &this_mv);
  best_sad =
      cpi->ppi->fn_ptr[bsize].sdf(src_buf, src_stride, ref_buf, ref_stride);

  // Evaluate zero MV if found MV is non-zero.
  if (best_int_mv->as_int != 0) {
    tmp_sad = cpi->ppi->fn_ptr[bsize].sdf(x->plane[0].src.buf, src_stride,
                                          xd->plane[0].pre[0].buf, ref_stride);
    *y_sad_zero = tmp_sad;
    if (tmp_sad < best_sad) {
      best_int_mv->as_fullmv = kZeroFullMv;
      this_mv = best_int_mv->as_fullmv;
      ref_buf = xd->plane[0].pre[0].buf;
      best_sad = tmp_sad;
    }
  } else {
    *y_sad_zero = best_sad;
  }

  if (!screen_scroll_superblock) {
    const uint8_t *const pos[4] = {
      ref_buf - ref_stride,
      ref_buf - 1,
      ref_buf + 1,
      ref_buf + ref_stride,
    };

    cpi->ppi->fn_ptr[bsize].sdx4df(src_buf, src_stride, pos, ref_stride,
                                   this_sad);

    for (idx = 0; idx < 4; ++idx) {
      if (this_sad[idx] < best_sad) {
        best_sad = this_sad[idx];
        best_int_mv->as_fullmv.row = search_pos[idx].row + this_mv.row;
        best_int_mv->as_fullmv.col = search_pos[idx].col + this_mv.col;
      }
    }

    if (this_sad[0] < this_sad[3])
      this_mv.row -= 1;
    else
      this_mv.row += 1;

    if (this_sad[1] < this_sad[2])
      this_mv.col -= 1;
    else
      this_mv.col += 1;

    ref_buf = get_buf_from_fullmv(&xd->plane[0].pre[0], &this_mv);

    tmp_sad =
        cpi->ppi->fn_ptr[bsize].sdf(src_buf, src_stride, ref_buf, ref_stride);
    if (best_sad > tmp_sad) {
      best_int_mv->as_fullmv = this_mv;
      best_sad = tmp_sad;
    }
  }

  FullMvLimits mv_limits = x->mv_limits;
  av1_set_mv_search_range(&mv_limits, ref_mv);
  clamp_fullmv(&best_int_mv->as_fullmv, &mv_limits);

  convert_fullmv_to_mv(best_int_mv);

  if (scaled_ref_frame) {
    int i;
    for (i = 0; i < MAX_MB_PLANE; i++) xd->plane[i].pre[0] = backup_yv12[i];
  }

  aom_free(hbuf);
  aom_free(vbuf);
  aom_free(src_hbuf);
  aom_free(src_vbuf);
  return best_sad;
}